

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_NoZeroRTTTicketWithoutEarlyDataContext_Test::TestBody
          (QUICMethodTest_NoZeroRTTTicketWithoutEarlyDataContext_Test *this)

{
  int iVar1;
  char *in_R9;
  UniquePtr<SSL_SESSION> session;
  SSL_QUIC_METHOD quic_method;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  undefined1 local_68 [32];
  unique_ptr<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
  local_48;
  SSL_QUIC_METHOD local_38;
  
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             &(this->super_QUICMethodTest).server_quic_early_data_context_,0,0);
  local_38.set_read_secret = QUICMethodTest::SetReadSecretCallback;
  local_38.set_write_secret = QUICMethodTest::SetWriteSecretCallback;
  local_38.add_handshake_data = QUICMethodTest::AddHandshakeDataCallback;
  local_38.flush_flight = QUICMethodTest::FlushFlightCallback;
  local_38.send_alert = QUICMethodTest::SendAlertCallback;
  SSL_CTX_set_session_cache_mode
            ((this->super_QUICMethodTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
  SSL_CTX_set_early_data_enabled
            ((this->super_QUICMethodTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,1);
  SSL_CTX_set_early_data_enabled
            ((this->super_QUICMethodTest).server_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,1);
  iVar1 = SSL_CTX_set_quic_method
                    ((this->super_QUICMethodTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&local_38);
  local_78[0] = (internal)(iVar1 != 0);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(local_68 + 0x10),local_78,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1db2,(char *)local_68._16_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_68);
LAB_001bcafc:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((unique_ptr<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
         *)local_68._16_8_ != &local_48) {
      operator_delete((void *)local_68._16_8_,
                      (ulong)((long)local_48._M_t.
                                    super___uniq_ptr_impl<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                                    .
                                    super__Head_base<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_false>
                                    ._M_head_impl + 1));
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._0_8_ + 8))();
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    return;
  }
  iVar1 = SSL_CTX_set_quic_method
                    ((this->super_QUICMethodTest).server_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&local_38);
  local_78[0] = (internal)(iVar1 != 0);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_78[0]) {
    testing::Message::Message((Message *)local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(local_68 + 0x10),local_78,
               (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1db3,(char *)local_68._16_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_68);
    goto LAB_001bcafc;
  }
  QUICMethodTest::CreateClientSessionForQUIC((QUICMethodTest *)local_68);
  local_78[0] = (internal)
                ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )local_68._0_8_ !=
                (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_68._0_8_ ==
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(local_68 + 0x10),local_78,(AssertionResult *)0x34e814,"false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_68 + 8),kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1db6,(char *)local_68._16_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_68 + 8),(Message *)&local_80);
  }
  else {
    iVar1 = SSL_SESSION_early_data_capable((SSL_SESSION *)local_68._0_8_);
    local_78[0] = (internal)(iVar1 == 0);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_78[0]) goto LAB_001bcbf5;
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(local_68 + 0x10),local_78,
               (AssertionResult *)"SSL_SESSION_early_data_capable(session.get())","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_68 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1db7,(char *)local_68._16_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_68 + 8),(Message *)&local_80);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_68 + 8));
  if ((ssl_ctx_st *)local_68._16_8_ != (ssl_ctx_st *)&local_48) {
    operator_delete((void *)local_68._16_8_,
                    (ulong)((long)local_48._M_t.
                                  super___uniq_ptr_impl<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                                  .
                                  super__Head_base<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_false>
                                  ._M_head_impl + 1));
  }
  if (local_80._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_80._M_head_impl + 8))();
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
LAB_001bcbf5:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_68);
  return;
}

Assistant:

TEST_F(QUICMethodTest, NoZeroRTTTicketWithoutEarlyDataContext) {
  server_quic_early_data_context_ = {};
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_early_data_enabled(client_ctx_.get(), 1);
  SSL_CTX_set_early_data_enabled(server_ctx_.get(), 1);
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  bssl::UniquePtr<SSL_SESSION> session = CreateClientSessionForQUIC();
  ASSERT_TRUE(session);
  EXPECT_FALSE(SSL_SESSION_early_data_capable(session.get()));
}